

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O0

int mbedtls_pk_write_pubkey_der(mbedtls_pk_context *key,uchar *buf,size_t size)

{
  size_t start;
  mbedtls_ecp_keypair *ec;
  char *local_60;
  char *oid;
  size_t sStack_50;
  mbedtls_pk_type_t pk_type;
  size_t oid_len;
  size_t par_len;
  size_t len;
  uchar *c;
  size_t sStack_28;
  int ret;
  size_t size_local;
  uchar *buf_local;
  mbedtls_pk_context *key_local;
  
  c._4_4_ = 0xffffff92;
  par_len = 0;
  oid_len = 0;
  if (size == 0) {
    key_local._4_4_ = -0x6c;
  }
  else {
    len = (size_t)(buf + size);
    sStack_28 = size;
    size_local = (size_t)buf;
    buf_local = (uchar *)key;
    c._4_4_ = mbedtls_pk_write_pubkey((uchar **)&len,buf,key);
    key_local._4_4_ = c._4_4_;
    if (-1 < c._4_4_) {
      if ((long)(len - size_local) < 1) {
        key_local._4_4_ = -0x6c;
      }
      else {
        *(undefined1 *)(len - 1) = 0;
        par_len = (long)c._4_4_ + par_len + 1;
        len = len - 1;
        c._4_4_ = mbedtls_asn1_write_len((uchar **)&len,(uchar *)size_local,par_len);
        key_local._4_4_ = c._4_4_;
        if (-1 < c._4_4_) {
          par_len = (long)c._4_4_ + par_len;
          c._4_4_ = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)size_local,'\x03');
          key_local._4_4_ = c._4_4_;
          if (-1 < c._4_4_) {
            par_len = (long)c._4_4_ + par_len;
            oid._4_4_ = mbedtls_pk_get_type((mbedtls_pk_context *)buf_local);
            start = size_local;
            if (oid._4_4_ == MBEDTLS_PK_ECKEY) {
              ec = mbedtls_pk_ec(*(mbedtls_pk_context *)buf_local);
              c._4_4_ = pk_write_ec_param((uchar **)&len,(uchar *)start,ec);
              if (c._4_4_ < 0) {
                return c._4_4_;
              }
              oid_len = (long)c._4_4_ + oid_len;
            }
            c._4_4_ = mbedtls_oid_get_oid_by_pk_alg(oid._4_4_,&local_60,&stack0xffffffffffffffb0);
            key_local._4_4_ = c._4_4_;
            if ((c._4_4_ == 0) &&
               (c._4_4_ = mbedtls_asn1_write_algorithm_identifier
                                    ((uchar **)&len,(uchar *)size_local,local_60,sStack_50,oid_len),
               key_local._4_4_ = c._4_4_, -1 < c._4_4_)) {
              par_len = (long)c._4_4_ + par_len;
              c._4_4_ = mbedtls_asn1_write_len((uchar **)&len,(uchar *)size_local,par_len);
              key_local._4_4_ = c._4_4_;
              if (-1 < c._4_4_) {
                par_len = (long)c._4_4_ + par_len;
                key_local._4_4_ = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)size_local,'0');
                if (-1 < key_local._4_4_) {
                  key_local._4_4_ = key_local._4_4_ + (int)par_len;
                }
              }
            }
          }
        }
      }
    }
  }
  return key_local._4_4_;
}

Assistant:

int mbedtls_pk_write_pubkey_der( mbedtls_pk_context *key, unsigned char *buf, size_t size )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *c;
    size_t len = 0, par_len = 0, oid_len;
    mbedtls_pk_type_t pk_type;
    const char *oid;

    PK_VALIDATE_RET( key != NULL );
    if( size == 0 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );
    PK_VALIDATE_RET( buf != NULL );

    c = buf + size;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_pk_write_pubkey( &c, buf, key ) );

    if( c - buf < 1 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    /*
     *  SubjectPublicKeyInfo  ::=  SEQUENCE  {
     *       algorithm            AlgorithmIdentifier,
     *       subjectPublicKey     BIT STRING }
     */
    *--c = 0;
    len += 1;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_BIT_STRING ) );

    pk_type = mbedtls_pk_get_type( key );
#if defined(MBEDTLS_ECP_C)
    if( pk_type == MBEDTLS_PK_ECKEY )
    {
        MBEDTLS_ASN1_CHK_ADD( par_len, pk_write_ec_param( &c, buf, mbedtls_pk_ec( *key ) ) );
    }
#endif
#if defined(MBEDTLS_USE_PSA_CRYPTO)
    if( pk_type == MBEDTLS_PK_OPAQUE )
    {
        psa_key_attributes_t attributes = PSA_KEY_ATTRIBUTES_INIT;
        psa_key_type_t key_type;
        psa_key_handle_t handle;
        psa_ecc_curve_t curve;
        size_t bits;

        handle = *((psa_key_handle_t*) key->pk_ctx );
        if( PSA_SUCCESS != psa_get_key_attributes( handle, &attributes ) )
            return( MBEDTLS_ERR_PK_HW_ACCEL_FAILED );
        key_type = psa_get_key_type( &attributes );
        bits = psa_get_key_bits( &attributes );
        psa_reset_key_attributes( &attributes );

        curve = PSA_KEY_TYPE_GET_CURVE( key_type );
        if( curve == 0 )
            return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

        ret = mbedtls_psa_get_ecc_oid_from_id( curve, bits, &oid, &oid_len );
        if( ret != 0 )
            return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

        /* Write EC algorithm parameters; that's akin
         * to pk_write_ec_param() above. */
        MBEDTLS_ASN1_CHK_ADD( par_len, mbedtls_asn1_write_oid( &c, buf,
                                                               oid, oid_len ) );

        /* The rest of the function works as for legacy EC contexts. */
        pk_type = MBEDTLS_PK_ECKEY;
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO */

    if( ( ret = mbedtls_oid_get_oid_by_pk_alg( pk_type, &oid,
                                               &oid_len ) ) != 0 )
    {
        return( ret );
    }

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_algorithm_identifier( &c, buf, oid, oid_len,
                                                        par_len ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                MBEDTLS_ASN1_SEQUENCE ) );

    return( (int) len );
}